

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O2

pcp_errno pcp_db_rem_flow(pcp_flow_t *f)

{
  size_t *psVar1;
  pcp_ctx_s *ppVar2;
  pcp_flow_t *ppVar3;
  pcp_flow_s **pppVar4;
  
  if ((f != (pcp_flow_t *)0x0) && (ppVar2 = f->ctx, ppVar2 != (pcp_ctx_s *)0x0)) {
    if ((ulong)f->key_bucket != 0xffffffff) {
      pppVar4 = (ppVar2->pcp_db).flows + f->key_bucket;
      while (ppVar3 = *pppVar4, ppVar3 != (pcp_flow_t *)0x0) {
        if (ppVar3 == f) {
          ppVar3->key_bucket = 0xffffffff;
          *pppVar4 = ppVar3->next;
          psVar1 = &(ppVar2->pcp_db).flow_cnt;
          *psVar1 = *psVar1 - 1;
          return PCP_ERR_SUCCESS;
        }
        pppVar4 = &ppVar3->next;
      }
    }
    return PCP_ERR_NOT_FOUND;
  }
  __assert_fail("f && f->ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0xbc,"pcp_errno pcp_db_rem_flow(pcp_flow_t *)");
}

Assistant:

pcp_errno pcp_db_rem_flow(pcp_flow_t *f) {
    pcp_flow_t **fdb = NULL;
    pcp_ctx_t *ctx;

    assert(f && f->ctx);

    if (f->key_bucket == EMPTY) {
        return PCP_ERR_NOT_FOUND;
    }

    ctx = f->ctx;
    PCP_LOG(PCP_LOGLVL_DEBUG, "Removing flow %p, key_bucket %d", f,
            f->key_bucket);

    for (fdb = ctx->pcp_db.flows + f->key_bucket; (*fdb) != NULL;
         fdb = &((*fdb)->next)) {
        if (*fdb == f) {
            (*fdb)->key_bucket = EMPTY;
            (*fdb) = (*fdb)->next;
            ctx->pcp_db.flow_cnt--;
            return PCP_ERR_SUCCESS;
        }
    }

    return PCP_ERR_NOT_FOUND;
}